

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O2

bitwidth_t __thiscall slang::SVInt::getMinRepresentedBits(SVInt *this)

{
  bool bVar1;
  bitwidth_t bVar2;
  bitwidth_t bVar3;
  
  if ((this->super_SVIntStorage).signFlag != false) {
    bVar1 = isNegative(this);
    if (bVar1) {
      bVar3 = (this->super_SVIntStorage).bitWidth;
      bVar2 = countLeadingOnes(this);
      bVar3 = bVar3 - bVar2;
    }
    else {
      bVar3 = getActiveBits(this);
    }
    return bVar3 + 1;
  }
  bVar3 = getActiveBits(this);
  return bVar3;
}

Assistant:

bitwidth_t getMinRepresentedBits() const {
        if (!signFlag)
            return getActiveBits();
        else if (isNegative())
            return bitWidth - countLeadingOnes() + 1;
        else
            return getActiveBits() + 1;
    }